

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall google::protobuf::Reflection::Swap(Reflection *this,Message *lhs,Message *rhs)

{
  char *pcVar1;
  Message *from;
  Nullable<const_char_*> pcVar2;
  MessageLite *this_00;
  LogMessage *pLVar3;
  Arena *pAVar4;
  Arena *arena;
  Metadata MVar5;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  Reflection *local_48 [2];
  Reflection *local_38;
  
  if (lhs == rhs) {
    return;
  }
  pAVar4 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  MVar5 = Message::GetMetadata(lhs);
  local_48[0] = MVar5.reflection;
  local_38 = this;
  pcVar2 = absl::lts_20250127::log_internal::
           Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                     (local_48,&local_38,"lhs->GetReflection() == this");
  if (pcVar2 == (Nullable<const_char_*>)0x0) {
    MVar5 = Message::GetMetadata(rhs);
    local_48[0] = MVar5.reflection;
    local_38 = this;
    pcVar2 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                       (local_48,&local_38,"rhs->GetReflection() == this");
    if (pcVar2 == (Nullable<const_char_*>)0x0) {
      if (pAVar4 != arena) {
        from = lhs;
        if (pAVar4 != (Arena *)0x0) {
          arena = pAVar4;
          from = rhs;
          rhs = lhs;
        }
        this_00 = MessageLite::New(&rhs->super_MessageLite,arena);
        Message::MergeFrom((Message *)this_00,from);
        Message::CopyFrom(from,rhs);
        Swap(this,rhs,(Message *)this_00);
        return;
      }
      UnsafeArenaSwap(this,lhs,rhs);
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x461,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_48,
                        (char (*) [37])"Second argument to Swap() (of type \"");
    MVar5 = Message::GetMetadata(rhs);
    pcVar1 = ((MVar5.descriptor)->all_names_).payload_;
    v_01._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v_01._M_str = pcVar1 + ~v_01._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_01);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [70])
                               "\") is not compatible with this reflection object (which is for type \""
                       );
    pcVar1 = (this->descriptor_->all_names_).payload_;
    v_02._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v_02._M_str = pcVar1 + ~v_02._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_02);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (pLVar3,(char (*) [79])
                      "\").  Note that the exact same class is required; not just the same descriptor."
              );
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x459,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_48,(char (*) [36])"First argument to Swap() (of type \""
                       );
    MVar5 = Message::GetMetadata(lhs);
    pcVar1 = ((MVar5.descriptor)->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v._M_str = pcVar1 + ~v._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [70])
                               "\") is not compatible with this reflection object (which is for type \""
                       );
    pcVar1 = (this->descriptor_->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    v_00._M_str = pcVar1 + ~v_00._M_len;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_00);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (pLVar3,(char (*) [79])
                      "\").  Note that the exact same class is required; not just the same descriptor."
              );
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

void Reflection::Swap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();

  // TODO:  Other Reflection methods should probably check this too.
  ABSL_CHECK_EQ(lhs->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << lhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  ABSL_CHECK_EQ(rhs->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << rhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (!internal::CanUseInternalSwap(lhs_arena, rhs_arena)) {
    // One of the two is guaranteed to have an arena.  Switch things around
    // to guarantee that lhs has an arena.
    Arena* arena = lhs_arena;
    if (arena == nullptr) {
      arena = rhs_arena;
      std::swap(lhs, rhs);  // Swapping names for pointers!
    }

    Message* temp = lhs->New(arena);
    temp->MergeFrom(*rhs);
    rhs->CopyFrom(*lhs);
    if (internal::DebugHardenForceCopyInSwap()) {
      lhs->CopyFrom(*temp);
      if (arena == nullptr) delete temp;
    } else {
      Swap(lhs, temp);
    }
    return;
  }

  UnsafeArenaSwap(lhs, rhs);
}